

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kron.cpp
# Opt level: O0

void test_qclab_dense_kron<std::complex<double>>(void)

{
  complex<double> m10;
  complex<double> m10_00;
  complex<double> m02;
  complex<double> m02_00;
  complex<double> m10_01;
  complex<double> m10_02;
  complex<double> m02_01;
  complex<double> m02_02;
  complex<double> m11;
  complex<double> m11_00;
  complex<double> m03;
  complex<double> m03_00;
  complex<double> m11_01;
  complex<double> m11_02;
  complex<double> m03_01;
  complex<double> m03_02;
  complex<double> m10_03;
  complex<double> m10_04;
  complex<double> m10_05;
  complex<double> m10_06;
  complex<double> m11_03;
  complex<double> m11_04;
  complex<double> m11_05;
  complex<double> m11_06;
  complex<double> m12;
  complex<double> m12_00;
  complex<double> m12_01;
  complex<double> m12_02;
  complex<double> m13;
  complex<double> m13_00;
  complex<double> m13_01;
  complex<double> m13_02;
  complex<double> m20;
  complex<double> m20_00;
  complex<double> m20_01;
  complex<double> m20_02;
  complex<double> m21;
  complex<double> m21_00;
  complex<double> m21_01;
  complex<double> m21_02;
  complex<double> m22;
  complex<double> m22_00;
  complex<double> m22_01;
  complex<double> m22_02;
  complex<double> m23;
  complex<double> m23_00;
  complex<double> m23_01;
  complex<double> m23_02;
  complex<double> m30;
  complex<double> m30_00;
  complex<double> m30_01;
  complex<double> m30_02;
  complex<double> m31;
  complex<double> m31_00;
  complex<double> m31_01;
  complex<double> m31_02;
  complex<double> m32;
  complex<double> m32_00;
  complex<double> m32_01;
  complex<double> m32_02;
  complex<double> m33;
  complex<double> m33_00;
  complex<double> m33_01;
  complex<double> m33_02;
  bool bVar1;
  undefined1 uVar2;
  char *message;
  undefined8 in_RCX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 in_RSI;
  SquareMatrix<std::complex<double>_> *pSVar3;
  Message *message_00;
  char *in_R8;
  char *in_R9;
  complex<double> m00;
  complex<double> m00_00;
  complex<double> m00_01;
  complex<double> m00_02;
  complex<double> m00_03;
  complex<double> m00_04;
  complex<double> m00_05;
  complex<double> m00_06;
  complex<double> m01;
  complex<double> m01_00;
  complex<double> m01_01;
  complex<double> m01_02;
  complex<double> m01_03;
  complex<double> m01_04;
  complex<double> m01_05;
  complex<double> m01_06;
  undefined8 in_stack_fffffffffffff7f8;
  undefined8 uVar4;
  undefined8 in_stack_fffffffffffff800;
  undefined8 uVar5;
  undefined8 in_stack_fffffffffffff808;
  undefined8 uVar6;
  undefined8 in_stack_fffffffffffff810;
  undefined8 uVar7;
  undefined7 in_stack_fffffffffffff8b8;
  undefined1 in_stack_fffffffffffff8bf;
  undefined8 in_stack_fffffffffffff8c0;
  undefined7 in_stack_fffffffffffff8c8;
  undefined1 in_stack_fffffffffffff8cf;
  undefined8 in_stack_fffffffffffff8d0;
  undefined1 *puVar8;
  string local_6f8;
  AssertHelper local_6d8;
  Message local_6d0;
  bool local_6c1;
  undefined1 local_6c0 [8];
  AssertionResult gtest_ar__3;
  undefined8 uStack_6a8;
  complex<double> local_6a0;
  complex<double> local_690;
  complex<double> local_680;
  complex<double> local_670;
  complex<double> local_660;
  complex<double> local_650;
  complex<double> local_640;
  complex<double> local_630;
  complex<double> local_620;
  complex<double> local_610;
  complex<double> local_600;
  complex<double> local_5f0;
  complex<double> local_5e0;
  complex<double> local_5d0;
  complex<double> local_5c0;
  undefined1 local_5b0 [8];
  SquareMatrix<std::complex<double>_> BoA_check;
  SquareMatrix<std::complex<double>_> BoA;
  AssertHelper local_570;
  Message local_568;
  bool local_559;
  undefined1 local_558 [8];
  AssertionResult gtest_ar__2;
  undefined8 uStack_540;
  complex<double> local_538;
  complex<double> local_528;
  complex<double> local_518;
  complex<double> local_508;
  complex<double> local_4f8;
  complex<double> local_4e8;
  complex<double> local_4d8;
  complex<double> local_4c8;
  complex<double> local_4b8;
  complex<double> local_4a8;
  complex<double> local_498;
  complex<double> local_488;
  complex<double> local_478;
  complex<double> local_468;
  complex<double> local_458;
  undefined1 local_448 [8];
  SquareMatrix<std::complex<double>_> AoB_check;
  SquareMatrix<std::complex<double>_> AoB;
  complex<double> local_418;
  complex<double> local_408;
  complex<double> local_3f8;
  undefined1 local_3e8 [8];
  SquareMatrix<std::complex<double>_> B;
  complex<double> local_3c8;
  complex<double> local_3b8;
  complex<double> local_3a8;
  undefined1 local_398 [8];
  SquareMatrix<std::complex<double>_> A;
  AssertHelper local_368;
  Message local_360;
  undefined1 local_351 [9];
  AssertionResult gtest_ar__1;
  undefined8 uStack_338;
  complex<double> local_330;
  complex<double> local_320;
  complex<double> local_310;
  complex<double> local_300;
  complex<double> local_2f0;
  complex<double> local_2e0;
  complex<double> local_2d0;
  complex<double> local_2c0;
  complex<double> local_2b0;
  complex<double> local_2a0;
  complex<double> local_290;
  complex<double> local_280;
  complex<double> local_270;
  complex<double> local_260;
  complex<double> local_250;
  undefined1 local_240 [8];
  SquareMatrix<std::complex<double>_> XoI_check;
  SquareMatrix<std::complex<double>_> XoI;
  AssertHelper local_200;
  Message local_1f8;
  bool local_1e9;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar_;
  undefined8 uStack_1d0;
  complex<double> local_1c8;
  complex<double> local_1b8;
  complex<double> local_1a8;
  complex<double> local_198;
  complex<double> local_188;
  complex<double> local_178;
  complex<double> local_168;
  complex<double> local_158;
  complex<double> local_148;
  complex<double> local_138;
  complex<double> local_128;
  complex<double> local_118;
  complex<double> local_108;
  complex<double> local_f8;
  complex<double> local_e8;
  undefined1 local_d8 [8];
  SquareMatrix<std::complex<double>_> IoX_check;
  SquareMatrix<std::complex<double>_> IoX;
  complex<double> local_a8;
  complex<double> local_98 [2];
  complex<double> local_78;
  undefined1 local_68 [8];
  SquareMatrix<std::complex<double>_> X;
  complex<double> local_48;
  complex<double> local_38;
  complex<double> local_28;
  undefined1 local_18 [8];
  SquareMatrix<std::complex<double>_> I;
  
  puVar8 = &stack0xfffffffffffff7f8;
  std::complex<double>::complex(&local_28,1.0,0.0);
  std::complex<double>::complex(&local_38,0.0,0.0);
  std::complex<double>::complex(&local_48,0.0,0.0);
  std::complex<double>::complex((complex<double> *)&X.data_,1.0,0.0);
  m10._M_value._8_8_ = in_stack_fffffffffffff800;
  m10._M_value._0_8_ = in_stack_fffffffffffff7f8;
  m11._M_value._8_8_ = in_stack_fffffffffffff810;
  m11._M_value._0_8_ = in_stack_fffffffffffff808;
  m00._M_value._8_8_ = extraout_RDX;
  m00._M_value._0_8_ = in_RSI;
  m01._M_value._8_8_ = in_R8;
  m01._M_value._0_8_ = in_RCX;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_18,m00,m01,m10,m11);
  std::complex<double>::complex(&local_78,0.0,0.0);
  std::complex<double>::complex(local_98,1.0,0.0);
  std::complex<double>::complex(&local_a8,1.0,0.0);
  std::complex<double>::complex((complex<double> *)&IoX.data_,0.0,0.0);
  m10_00._M_value._8_8_ = in_stack_fffffffffffff800;
  m10_00._M_value._0_8_ = in_stack_fffffffffffff7f8;
  m11_00._M_value._8_8_ = in_stack_fffffffffffff810;
  m11_00._M_value._0_8_ = in_stack_fffffffffffff808;
  m00_00._M_value._8_8_ = extraout_RDX_00;
  m00_00._M_value._0_8_ = in_RSI;
  m01_00._M_value._8_8_ = in_R8;
  m01_00._M_value._0_8_ = in_RCX;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_68,m00_00,m01_00,m10_00,m11_00);
  pSVar3 = (SquareMatrix<std::complex<double>_> *)local_18;
  qclab::dense::kron<std::complex<double>>
            ((dense *)&IoX_check.data_,pSVar3,(SquareMatrix<std::complex<double>_> *)local_68);
  std::complex<double>::complex(&local_e8,0.0,0.0);
  std::complex<double>::complex(&local_f8,1.0,0.0);
  std::complex<double>::complex(&local_108,0.0,0.0);
  std::complex<double>::complex(&local_118,0.0,0.0);
  std::complex<double>::complex(&local_128,1.0,0.0);
  std::complex<double>::complex(&local_138,0.0,0.0);
  std::complex<double>::complex(&local_148,0.0,0.0);
  std::complex<double>::complex(&local_158,0.0,0.0);
  std::complex<double>::complex(&local_168,0.0,0.0);
  std::complex<double>::complex(&local_178,0.0,0.0);
  std::complex<double>::complex(&local_188,0.0,0.0);
  std::complex<double>::complex(&local_198,1.0,0.0);
  std::complex<double>::complex(&local_1a8,0.0,0.0);
  std::complex<double>::complex(&local_1b8,0.0,0.0);
  std::complex<double>::complex(&local_1c8,1.0,0.0);
  std::complex<double>::complex((complex<double> *)&gtest_ar_.message_,0.0,0.0);
  m02._M_value._8_8_ = local_128._M_value._8_8_;
  m02._M_value._0_8_ = local_128._M_value._0_8_;
  m03._M_value._8_8_ = local_138._M_value._8_8_;
  m03._M_value._0_8_ = local_138._M_value._0_8_;
  m10_03._M_value._8_8_ = local_148._M_value._8_8_;
  m10_03._M_value._0_8_ = local_148._M_value._0_8_;
  m11_03._M_value._8_8_ = local_158._M_value._8_8_;
  m11_03._M_value._0_8_ = local_158._M_value._0_8_;
  m12._M_value._8_8_ = local_168._M_value._8_8_;
  m12._M_value._0_8_ = local_168._M_value._0_8_;
  m13._M_value._8_8_ = local_178._M_value._8_8_;
  m13._M_value._0_8_ = local_178._M_value._0_8_;
  m20._M_value._8_8_ = local_188._M_value._8_8_;
  m20._M_value._0_8_ = local_188._M_value._0_8_;
  m21._M_value._8_8_ = local_198._M_value._8_8_;
  m21._M_value._0_8_ = local_198._M_value._0_8_;
  m22._M_value._8_8_ = local_1a8._M_value._8_8_;
  m22._M_value._0_8_ = local_1a8._M_value._0_8_;
  m23._M_value._8_8_ = local_1b8._M_value._8_8_;
  m23._M_value._0_8_ = local_1b8._M_value._0_8_;
  m30._M_value._8_8_ = local_1c8._M_value._8_8_;
  m30._M_value._0_8_ = local_1c8._M_value._0_8_;
  m31._M_value._8_8_ = uStack_1d0;
  m31._M_value._0_8_ =
       gtest_ar_.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  m32._M_value[7] = in_stack_fffffffffffff8bf;
  m32._M_value._0_7_ = in_stack_fffffffffffff8b8;
  m32._M_value._8_8_ = in_stack_fffffffffffff8c0;
  m33._M_value[7] = in_stack_fffffffffffff8cf;
  m33._M_value._0_7_ = in_stack_fffffffffffff8c8;
  m33._M_value._8_8_ = in_stack_fffffffffffff8d0;
  m00_01._M_value._8_8_ = extraout_RDX_01;
  m00_01._M_value._0_8_ = pSVar3;
  m01_01._M_value._8_8_ = in_R8;
  m01_01._M_value._0_8_ = in_RCX;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_d8,m00_01,m01_01,m02,m03,m10_03,m11_03,m12
             ,m13,m20,m21,m22,m23,m30,m31,m32,m33);
  local_1e9 = qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                        ((SquareMatrix<std::complex<double>_> *)&IoX_check.data_,
                         (SquareMatrix<std::complex<double>_> *)local_d8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1e8,&local_1e9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
  if (!bVar1) {
    testing::Message::Message(&local_1f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&XoI.data_,(internal *)local_1e8,(AssertionResult *)"IoX == IoX_check",
               "false","true",in_R9);
    in_R8 = (char *)std::__cxx11::string::c_str();
    in_RCX = 0x14;
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/kron.cpp"
               ,0x14,in_R8);
    testing::internal::AssertHelper::operator=(&local_200,&local_1f8);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    std::__cxx11::string::~string((string *)&XoI.data_);
    testing::Message::~Message(&local_1f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
  pSVar3 = (SquareMatrix<std::complex<double>_> *)local_68;
  qclab::dense::kron<std::complex<double>>
            ((dense *)&XoI_check.data_,pSVar3,(SquareMatrix<std::complex<double>_> *)local_18);
  std::complex<double>::complex(&local_250,0.0,0.0);
  std::complex<double>::complex(&local_260,0.0,0.0);
  std::complex<double>::complex(&local_270,1.0,0.0);
  std::complex<double>::complex(&local_280,0.0,0.0);
  std::complex<double>::complex(&local_290,0.0,0.0);
  std::complex<double>::complex(&local_2a0,0.0,0.0);
  std::complex<double>::complex(&local_2b0,0.0,0.0);
  std::complex<double>::complex(&local_2c0,1.0,0.0);
  std::complex<double>::complex(&local_2d0,1.0,0.0);
  std::complex<double>::complex(&local_2e0,0.0,0.0);
  std::complex<double>::complex(&local_2f0,0.0,0.0);
  std::complex<double>::complex(&local_300,0.0,0.0);
  std::complex<double>::complex(&local_310,0.0,0.0);
  std::complex<double>::complex(&local_320,1.0,0.0);
  std::complex<double>::complex(&local_330,0.0,0.0);
  std::complex<double>::complex((complex<double> *)&gtest_ar__1.message_,0.0,0.0);
  m02_00._M_value._8_8_ = local_290._M_value._8_8_;
  m02_00._M_value._0_8_ = local_290._M_value._0_8_;
  m03_00._M_value._8_8_ = local_2a0._M_value._8_8_;
  m03_00._M_value._0_8_ = local_2a0._M_value._0_8_;
  m10_04._M_value._8_8_ = local_2b0._M_value._8_8_;
  m10_04._M_value._0_8_ = local_2b0._M_value._0_8_;
  m11_04._M_value._8_8_ = local_2c0._M_value._8_8_;
  m11_04._M_value._0_8_ = local_2c0._M_value._0_8_;
  m12_00._M_value._8_8_ = local_2d0._M_value._8_8_;
  m12_00._M_value._0_8_ = local_2d0._M_value._0_8_;
  m13_00._M_value._8_8_ = local_2e0._M_value._8_8_;
  m13_00._M_value._0_8_ = local_2e0._M_value._0_8_;
  m20_00._M_value._8_8_ = local_2f0._M_value._8_8_;
  m20_00._M_value._0_8_ = local_2f0._M_value._0_8_;
  m21_00._M_value._8_8_ = local_300._M_value._8_8_;
  m21_00._M_value._0_8_ = local_300._M_value._0_8_;
  m22_00._M_value._8_8_ = local_310._M_value._8_8_;
  m22_00._M_value._0_8_ = local_310._M_value._0_8_;
  m23_00._M_value._8_8_ = local_320._M_value._8_8_;
  m23_00._M_value._0_8_ = local_320._M_value._0_8_;
  m30_00._M_value._8_8_ = local_330._M_value._8_8_;
  m30_00._M_value._0_8_ = local_330._M_value._0_8_;
  m31_00._M_value._8_8_ = uStack_338;
  m31_00._M_value._0_8_ =
       gtest_ar__1.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  m32_00._M_value[7] = in_stack_fffffffffffff8bf;
  m32_00._M_value._0_7_ = in_stack_fffffffffffff8b8;
  m32_00._M_value._8_8_ = in_stack_fffffffffffff8c0;
  m33_00._M_value[7] = in_stack_fffffffffffff8cf;
  m33_00._M_value._0_7_ = in_stack_fffffffffffff8c8;
  m33_00._M_value._8_8_ = in_stack_fffffffffffff8d0;
  m00_02._M_value._8_8_ = extraout_RDX_02;
  m00_02._M_value._0_8_ = pSVar3;
  m01_02._M_value._8_8_ = in_R8;
  m01_02._M_value._0_8_ = in_RCX;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_240,m00_02,m01_02,m02_00,m03_00,m10_04,
             m11_04,m12_00,m13_00,m20_00,m21_00,m22_00,m23_00,m30_00,m31_00,m32_00,m33_00);
  local_351[0] = qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                           ((SquareMatrix<std::complex<double>_> *)&XoI_check.data_,
                            (SquareMatrix<std::complex<double>_> *)local_240);
  message_00 = (Message *)local_351;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)(local_351 + 1),(bool *)message_00,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_351 + 1));
  uVar4 = local_290._M_value._0_8_;
  uVar5 = local_290._M_value._8_8_;
  uVar6 = local_2a0._M_value._0_8_;
  uVar7 = local_2a0._M_value._8_8_;
  if (!bVar1) {
    testing::Message::Message(&local_360);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&A.data_,(internal *)(local_351 + 1),(AssertionResult *)"XoI == XoI_check",
               "false","true",in_R9);
    in_R8 = (char *)std::__cxx11::string::c_str();
    in_RCX = 0x1c;
    testing::internal::AssertHelper::AssertHelper
              (&local_368,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/kron.cpp"
               ,0x1c,in_R8);
    message_00 = &local_360;
    testing::internal::AssertHelper::operator=(&local_368,message_00);
    testing::internal::AssertHelper::~AssertHelper(&local_368);
    std::__cxx11::string::~string((string *)&A.data_);
    testing::Message::~Message(&local_360);
    uVar4 = local_290._M_value._0_8_;
    uVar5 = local_290._M_value._8_8_;
    uVar6 = local_2a0._M_value._0_8_;
    uVar7 = local_2a0._M_value._8_8_;
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_351 + 1));
  std::complex<double>::complex(&local_3a8,1.0,0.0);
  std::complex<double>::complex(&local_3b8,2.0,0.0);
  std::complex<double>::complex(&local_3c8,3.0,0.0);
  std::complex<double>::complex((complex<double> *)&B.data_,5.0,0.0);
  m10_01._M_value._8_8_ = uVar5;
  m10_01._M_value._0_8_ = uVar4;
  m11_01._M_value._8_8_ = uVar7;
  m11_01._M_value._0_8_ = uVar6;
  m00_03._M_value._8_8_ = extraout_RDX_03;
  m00_03._M_value._0_8_ = message_00;
  m01_03._M_value._8_8_ = in_R8;
  m01_03._M_value._0_8_ = in_RCX;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_398,m00_03,m01_03,m10_01,m11_01);
  std::complex<double>::complex(&local_3f8,7.0,0.0);
  std::complex<double>::complex(&local_408,11.0,0.0);
  std::complex<double>::complex(&local_418,13.0,0.0);
  std::complex<double>::complex((complex<double> *)&AoB.data_,17.0,0.0);
  m10_02._M_value._8_8_ = uVar5;
  m10_02._M_value._0_8_ = uVar4;
  m11_02._M_value._8_8_ = uVar7;
  m11_02._M_value._0_8_ = uVar6;
  m00_04._M_value._8_8_ = extraout_RDX_04;
  m00_04._M_value._0_8_ = message_00;
  m01_04._M_value._8_8_ = in_R8;
  m01_04._M_value._0_8_ = in_RCX;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_3e8,m00_04,m01_04,m10_02,m11_02);
  pSVar3 = (SquareMatrix<std::complex<double>_> *)local_398;
  qclab::dense::kron<std::complex<double>>
            ((dense *)&AoB_check.data_,pSVar3,(SquareMatrix<std::complex<double>_> *)local_3e8);
  std::complex<double>::complex(&local_458,7.0,0.0);
  std::complex<double>::complex(&local_468,11.0,0.0);
  std::complex<double>::complex(&local_478,14.0,0.0);
  std::complex<double>::complex(&local_488,22.0,0.0);
  std::complex<double>::complex(&local_498,13.0,0.0);
  std::complex<double>::complex(&local_4a8,17.0,0.0);
  std::complex<double>::complex(&local_4b8,26.0,0.0);
  std::complex<double>::complex(&local_4c8,34.0,0.0);
  std::complex<double>::complex(&local_4d8,21.0,0.0);
  std::complex<double>::complex(&local_4e8,33.0,0.0);
  std::complex<double>::complex(&local_4f8,35.0,0.0);
  std::complex<double>::complex(&local_508,55.0,0.0);
  std::complex<double>::complex(&local_518,39.0,0.0);
  std::complex<double>::complex(&local_528,51.0,0.0);
  std::complex<double>::complex(&local_538,65.0,0.0);
  std::complex<double>::complex((complex<double> *)&gtest_ar__2.message_,85.0,0.0);
  m02_01._M_value._8_8_ = local_498._M_value._8_8_;
  m02_01._M_value._0_8_ = local_498._M_value._0_8_;
  m03_01._M_value._8_8_ = local_4a8._M_value._8_8_;
  m03_01._M_value._0_8_ = local_4a8._M_value._0_8_;
  m10_05._M_value._8_8_ = local_4b8._M_value._8_8_;
  m10_05._M_value._0_8_ = local_4b8._M_value._0_8_;
  m11_05._M_value._8_8_ = local_4c8._M_value._8_8_;
  m11_05._M_value._0_8_ = local_4c8._M_value._0_8_;
  m12_01._M_value._8_8_ = local_4d8._M_value._8_8_;
  m12_01._M_value._0_8_ = local_4d8._M_value._0_8_;
  m13_01._M_value._8_8_ = local_4e8._M_value._8_8_;
  m13_01._M_value._0_8_ = local_4e8._M_value._0_8_;
  m20_01._M_value._8_8_ = local_4f8._M_value._8_8_;
  m20_01._M_value._0_8_ = local_4f8._M_value._0_8_;
  m21_01._M_value._8_8_ = local_508._M_value._8_8_;
  m21_01._M_value._0_8_ = local_508._M_value._0_8_;
  m22_01._M_value._8_8_ = local_518._M_value._8_8_;
  m22_01._M_value._0_8_ = local_518._M_value._0_8_;
  m23_01._M_value._8_8_ = local_528._M_value._8_8_;
  m23_01._M_value._0_8_ = local_528._M_value._0_8_;
  m30_01._M_value._8_8_ = local_538._M_value._8_8_;
  m30_01._M_value._0_8_ = local_538._M_value._0_8_;
  m31_01._M_value._8_8_ = uStack_540;
  m31_01._M_value._0_8_ =
       gtest_ar__2.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  m32_01._M_value[7] = in_stack_fffffffffffff8bf;
  m32_01._M_value._0_7_ = in_stack_fffffffffffff8b8;
  m32_01._M_value._8_8_ = in_stack_fffffffffffff8c0;
  m33_01._M_value[7] = in_stack_fffffffffffff8cf;
  m33_01._M_value._0_7_ = in_stack_fffffffffffff8c8;
  m33_01._M_value._8_8_ = &stack0xfffffffffffff7f8;
  m00_05._M_value._8_8_ = extraout_RDX_05;
  m00_05._M_value._0_8_ = pSVar3;
  m01_05._M_value._8_8_ = in_R8;
  m01_05._M_value._0_8_ = in_RCX;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_448,m00_05,m01_05,m02_01,m03_01,m10_05,
             m11_05,m12_01,m13_01,m20_01,m21_01,m22_01,m23_01,m30_01,m31_01,m32_01,m33_01);
  uVar2 = qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                    ((SquareMatrix<std::complex<double>_> *)&AoB_check.data_,
                     (SquareMatrix<std::complex<double>_> *)local_448);
  local_559 = (bool)uVar2;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_558,&local_559,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_558);
  if (!bVar1) {
    testing::Message::Message(&local_568);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&BoA.data_,(internal *)local_558,(AssertionResult *)"AoB == AoB_check",
               "false","true",in_R9);
    in_R8 = (char *)std::__cxx11::string::c_str();
    in_RCX = 0x2b;
    testing::internal::AssertHelper::AssertHelper
              (&local_570,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/kron.cpp"
               ,0x2b,in_R8);
    testing::internal::AssertHelper::operator=(&local_570,&local_568);
    testing::internal::AssertHelper::~AssertHelper(&local_570);
    std::__cxx11::string::~string((string *)&BoA.data_);
    testing::Message::~Message(&local_568);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_558);
  pSVar3 = (SquareMatrix<std::complex<double>_> *)local_3e8;
  qclab::dense::kron<std::complex<double>>
            ((dense *)&BoA_check.data_,pSVar3,(SquareMatrix<std::complex<double>_> *)local_398);
  std::complex<double>::complex(&local_5c0,7.0,0.0);
  std::complex<double>::complex(&local_5d0,14.0,0.0);
  std::complex<double>::complex(&local_5e0,11.0,0.0);
  std::complex<double>::complex(&local_5f0,22.0,0.0);
  std::complex<double>::complex(&local_600,21.0,0.0);
  std::complex<double>::complex(&local_610,35.0,0.0);
  std::complex<double>::complex(&local_620,33.0,0.0);
  std::complex<double>::complex(&local_630,55.0,0.0);
  std::complex<double>::complex(&local_640,13.0,0.0);
  std::complex<double>::complex(&local_650,26.0,0.0);
  std::complex<double>::complex(&local_660,17.0,0.0);
  std::complex<double>::complex(&local_670,34.0,0.0);
  std::complex<double>::complex(&local_680,39.0,0.0);
  std::complex<double>::complex(&local_690,65.0,0.0);
  std::complex<double>::complex(&local_6a0,51.0,0.0);
  std::complex<double>::complex((complex<double> *)&gtest_ar__3.message_,85.0,0.0);
  m02_02._M_value._8_8_ = local_600._M_value._8_8_;
  m02_02._M_value._0_8_ = local_600._M_value._0_8_;
  m03_02._M_value._8_8_ = local_610._M_value._8_8_;
  m03_02._M_value._0_8_ = local_610._M_value._0_8_;
  m10_06._M_value._8_8_ = local_620._M_value._8_8_;
  m10_06._M_value._0_8_ = local_620._M_value._0_8_;
  m11_06._M_value._8_8_ = local_630._M_value._8_8_;
  m11_06._M_value._0_8_ = local_630._M_value._0_8_;
  m12_02._M_value._8_8_ = local_640._M_value._8_8_;
  m12_02._M_value._0_8_ = local_640._M_value._0_8_;
  m13_02._M_value._8_8_ = local_650._M_value._8_8_;
  m13_02._M_value._0_8_ = local_650._M_value._0_8_;
  m20_02._M_value._8_8_ = local_660._M_value._8_8_;
  m20_02._M_value._0_8_ = local_660._M_value._0_8_;
  m21_02._M_value._8_8_ = local_670._M_value._8_8_;
  m21_02._M_value._0_8_ = local_670._M_value._0_8_;
  m22_02._M_value._8_8_ = local_680._M_value._8_8_;
  m22_02._M_value._0_8_ = local_680._M_value._0_8_;
  m23_02._M_value._8_8_ = local_690._M_value._8_8_;
  m23_02._M_value._0_8_ = local_690._M_value._0_8_;
  m30_02._M_value._8_8_ = local_6a0._M_value._8_8_;
  m30_02._M_value._0_8_ = local_6a0._M_value._0_8_;
  m31_02._M_value._8_8_ = uStack_6a8;
  m31_02._M_value._0_8_ =
       gtest_ar__3.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  m32_02._M_value[7] = in_stack_fffffffffffff8bf;
  m32_02._M_value._0_7_ = in_stack_fffffffffffff8b8;
  m32_02._M_value._8_8_ = &stack0xfffffffffffff7f8;
  m33_02._M_value[7] = uVar2;
  m33_02._M_value._0_7_ = in_stack_fffffffffffff8c8;
  m33_02._M_value._8_8_ = puVar8;
  m00_06._M_value._8_8_ = extraout_RDX_06;
  m00_06._M_value._0_8_ = pSVar3;
  m01_06._M_value._8_8_ = in_R8;
  m01_06._M_value._0_8_ = in_RCX;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_5b0,m00_06,m01_06,m02_02,m03_02,m10_06,
             m11_06,m12_02,m13_02,m20_02,m21_02,m22_02,m23_02,m30_02,m31_02,m32_02,m33_02);
  local_6c1 = qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                        ((SquareMatrix<std::complex<double>_> *)&BoA_check.data_,
                         (SquareMatrix<std::complex<double>_> *)local_5b0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_6c0,&local_6c1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6c0);
  if (!bVar1) {
    testing::Message::Message(&local_6d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_6f8,(internal *)local_6c0,(AssertionResult *)"BoA == BoA_check","false","true"
               ,in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_6d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/kron.cpp"
               ,0x33,message);
    testing::internal::AssertHelper::operator=(&local_6d8,&local_6d0);
    testing::internal::AssertHelper::~AssertHelper(&local_6d8);
    std::__cxx11::string::~string((string *)&local_6f8);
    testing::Message::~Message(&local_6d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6c0);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_5b0);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&BoA_check.data_);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_448);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&AoB_check.data_);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_3e8);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_398);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_240);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&XoI_check.data_);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_d8);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&IoX_check.data_);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_68);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_18);
  return;
}

Assistant:

void test_qclab_dense_kron() {

  qclab::dense::SquareMatrix< T >  I( 1 , 0 ,
                                      0 , 1 ) ;
  qclab::dense::SquareMatrix< T >  X( 0 , 1 ,
                                      1 , 0 ) ;
//std::cout << "I =\n" ; qclab::printMatrix2x2( I ) ;
//std::cout << "X =\n" ; qclab::printMatrix2x2( X ) ;

  qclab::dense::SquareMatrix< T >  IoX = qclab::dense::kron( I , X ) ;
  qclab::dense::SquareMatrix< T >  IoX_check( 0 , 1 , 0 , 0 ,
                                              1 , 0 , 0 , 0 ,
                                              0 , 0 , 0 , 1 ,
                                              0 , 0 , 1 , 0 ) ;
  EXPECT_TRUE( IoX == IoX_check ) ;
//std::cout << "I otimes X =\n" ; qclab::printMatrix4x4( IoX ) ;

  qclab::dense::SquareMatrix< T >  XoI = qclab::dense::kron( X , I ) ;
  qclab::dense::SquareMatrix< T >  XoI_check( 0 , 0 , 1 , 0 ,
                                              0 , 0 , 0 , 1 ,
                                              1 , 0 , 0 , 0 ,
                                              0 , 1 , 0 , 0 ) ;
  EXPECT_TRUE( XoI == XoI_check ) ;
//std::cout << "X otimes I =\n" ; qclab::printMatrix4x4( XoI ) ;

  qclab::dense::SquareMatrix< T >  A(  1 ,  2 ,
                                       3 ,  5 ) ;
  qclab::dense::SquareMatrix< T >  B(  7 , 11 ,
                                      13 , 17 ) ;
//std::cout << "A =\n" ; qclab::printMatrix2x2( A ) ;
//std::cout << "B =\n" ; qclab::printMatrix2x2( B ) ;

  qclab::dense::SquareMatrix< T >  AoB = qclab::dense::kron( A , B ) ;
  qclab::dense::SquareMatrix< T >  AoB_check(  7 , 11 , 14 , 22 ,
                                              13 , 17 , 26 , 34 ,
                                              21 , 33 , 35 , 55 ,
                                              39 , 51 , 65 , 85 ) ;
  EXPECT_TRUE( AoB == AoB_check ) ;
//std::cout << "A otimes B =\n" ; qclab::printMatrix4x4( AoB ) ;

  qclab::dense::SquareMatrix< T >  BoA = qclab::dense::kron( B , A ) ;
  qclab::dense::SquareMatrix< T >  BoA_check(  7 , 14 , 11 , 22 ,
                                              21 , 35 , 33 , 55 ,
                                              13 , 26 , 17 , 34 ,
                                              39 , 65 , 51 , 85 ) ;
  EXPECT_TRUE( BoA == BoA_check ) ;
//std::cout << "B otimes A =\n" ; qclab::printMatrix4x4( BoA ) ;

}